

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::runTest
               (TestLog *log,ResultCollector *results,RenderContext *renderContext,
               BlendState *preCommonBlendState,BlendState *postCommonBlendState,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers)

{
  deUint8 *pdVar1;
  GLsizei GVar2;
  GLsizei GVar3;
  PrimitiveType PVar4;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar5;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar6;
  BlendFunc *pBVar7;
  Vector<bool,_4> *pVVar8;
  GLboolean *pGVar9;
  GLenum *pGVar10;
  undefined1 auVar11 [8];
  undefined8 imageSetDesc;
  _Alloc_hider _Var12;
  undefined1 auVar13 [8];
  pointer pTVar14;
  pointer pTVar15;
  bool bVar16;
  bool bVar17;
  int i_3;
  int iVar18;
  deUint32 dVar19;
  TextureChannelClass TVar20;
  ContextType CVar21;
  undefined4 extraout_var;
  ObjectTraits *pOVar23;
  TextureFormat *pTVar24;
  pointer pDVar25;
  long *plVar26;
  undefined4 extraout_var_00;
  char *pcVar27;
  mapped_type *pmVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  ostream *poVar30;
  size_t sVar31;
  glDisableiFunc *pp_Var32;
  bool *pbVar33;
  undefined4 extraout_var_01;
  undefined8 *puVar34;
  uint uVar35;
  uint uVar36;
  undefined4 uVar37;
  size_type *psVar38;
  PrimitiveType PVar39;
  int iVar40;
  GLuint GVar41;
  GLenum GVar42;
  long lVar43;
  char *pcVar44;
  undefined8 uVar45;
  ulong uVar46;
  TextureFormat TVar47;
  pointer pDVar48;
  int iVar49;
  long lVar50;
  long lVar51;
  TextureLevel *pTVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  string desc;
  ScopedLogSection drawBufferSection;
  ScopedLogSection drawBuffersSection;
  VertexAttrib vertexAttribs [1];
  RenderState renderState;
  size_type __dnew_3;
  ScopedLogSection s;
  TextureFormat format;
  TextureFormatInfo info;
  Renderer renderer;
  size_type __dnew_4;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> refRenderbuffers;
  Framebuffer framebuffer;
  RenderbufferVector renderbuffers;
  size_type __dnew;
  Vec4 threshold_1;
  Vector<int,_4> res;
  long local_6d0;
  undefined1 local_6b8 [8];
  anon_union_8_2_d0736028_for_Maybe<bool>_2 aStack_6b0;
  undefined1 local_6a8 [8];
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  aStack_6a0;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_688;
  undefined1 local_680 [32];
  Vector<bool,_4> *local_660;
  Vector<bool,_4> local_658 [4];
  undefined1 local_648 [16];
  key_type *local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_630;
  PrimitiveList *local_620;
  undefined1 local_618 [12];
  uint uStack_60c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  _Base_ptr local_5f8;
  pointer local_5f0;
  BlendState *local_5e0;
  undefined1 local_5d8 [16];
  undefined1 *local_5c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5c0;
  RenderContext *local_5a8;
  long local_5a0;
  undefined1 local_598 [8];
  TextureFormat TStack_590;
  undefined1 local_588 [100];
  undefined4 local_524;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_508;
  deUint32 local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  uint uStack_4d0;
  undefined8 local_4cc;
  undefined4 local_4c4;
  undefined1 local_4c0;
  undefined8 local_4bc;
  key_type local_4a8;
  undefined1 local_480 [8];
  TextureFormat local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  pointer local_460;
  undefined4 local_448;
  undefined1 local_440;
  ChannelType aCStack_43c [2];
  TextureFormat local_434;
  pointer local_428;
  undefined1 local_420 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  BlendFunc local_3e0;
  BlendFunc BStack_3d8;
  undefined1 local_3d0 [24];
  bool local_3b8;
  TextureFormat local_3b0;
  string local_3a8;
  ResultCollector *local_380;
  undefined1 local_378 [8];
  undefined1 auStack_370 [8];
  undefined1 local_368 [24];
  ulong local_350;
  VertexArrayPointer local_348 [2];
  ios_base local_308 [8];
  ios_base local_300 [264];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  PrimitiveList local_1e8;
  long local_1c8;
  long local_1c0;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> local_1b8;
  ObjectWrapper local_1a0;
  TextureFormat local_188;
  ObjectVector local_180;
  ShaderProgram local_158;
  Vec4 local_88;
  PrimitiveType local_78 [18];
  Functions *pFVar22;
  
  local_5e0 = preCommonBlendState;
  local_5a8 = renderContext;
  local_380 = results;
  iVar18 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  pFVar22 = (Functions *)CONCAT44(extraout_var,iVar18);
  pDVar25 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pDVar48 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pOVar23 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectVector::ObjectVector(&local_180,pFVar22,pOVar23,(long)pDVar25 - (long)pDVar48 >> 7);
  pOVar23 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_1a0,pFVar22,pOVar23);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            (&local_1b8,
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 7,(allocator_type *)local_378);
  local_378 = (undefined1  [8])local_368;
  local_368._0_4_ = 4.5725952e+33;
  local_368._4_2_ = 0x7542;
  local_368[6] = 'f';
  local_368[7] = 'f';
  local_368[8] = 'e';
  local_368._9_2_ = 0x7372;
  auStack_370._0_4_ = BGRA;
  auStack_370._4_4_ = SNORM_INT8;
  local_368[0xb] = '\0';
  local_588._0_8_ = (undefined1 *)0x6675622077617244;
  TStack_590.order = sR;
  TStack_590.type = SNORM_INT8;
  local_588._8_5_ = 0x73726566;
  local_598 = (undefined1  [8])local_588;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)local_618,log,(string *)local_378,(string *)local_598);
  if (local_598 != (undefined1  [8])local_588) {
    operator_delete((void *)local_598,(ulong)(local_588._0_8_ + 1));
  }
  if (local_378 != (undefined1  [8])local_368) {
    operator_delete((void *)local_378,
                    CONCAT17(local_368[7],
                             CONCAT16(local_368[6],CONCAT24(local_368._4_2_,local_368._0_4_))) + 1);
  }
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(drawBuffers->
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 7)) {
    local_6d0 = 0;
    local_5a0 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
      iVar18 = (int)local_5a0;
      std::ostream::operator<<((MessageBuilder *)local_378,iVar18);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
      std::ios_base::~ios_base(local_308);
      pTVar24 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x1d04f18);
      local_598 = (undefined1  [8])local_588;
      TVar47 = (TextureFormat)(pTVar24 + 2);
      if (*pTVar24 == TVar47) {
        local_588._0_8_ = *(undefined8 *)TVar47;
        local_588._8_8_ = pTVar24[3];
      }
      else {
        local_588._0_8_ = *(undefined8 *)TVar47;
        local_598 = (undefined1  [8])*pTVar24;
      }
      TStack_590 = pTVar24[1];
      *pTVar24 = TVar47;
      pTVar24[1].order = R;
      pTVar24[1].type = SNORM_INT8;
      *(undefined1 *)&pTVar24[2].order = R;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
      std::ostream::operator<<((MessageBuilder *)local_378,iVar18);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
      std::ios_base::~ios_base(local_308);
      pTVar24 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)local_6b8,0,(char *)0x0,0x1ccbfba);
      TVar47 = (TextureFormat)(pTVar24 + 2);
      if (*pTVar24 == TVar47) {
        local_470._M_allocated_capacity = *(undefined8 *)TVar47;
        local_470._8_8_ = pTVar24[3];
        local_480 = (undefined1  [8])&local_470;
      }
      else {
        local_470._M_allocated_capacity = *(undefined8 *)TVar47;
        local_480 = (undefined1  [8])*pTVar24;
      }
      local_478 = pTVar24[1];
      *pTVar24 = TVar47;
      pTVar24[1].order = R;
      pTVar24[1].type = SNORM_INT8;
      *(undefined1 *)&pTVar24[2].order = R;
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)local_648,log,(string *)local_598,(string *)local_480);
      if (local_480 != (undefined1  [8])&local_470) {
        operator_delete((void *)local_480,(ulong)(local_470._M_allocated_capacity + 1));
      }
      if (local_6b8 != (undefined1  [8])(local_6b8 + 0x10)) {
        operator_delete((void *)local_6b8,(long)local_6a8 + 1);
      }
      if (local_598 != (undefined1  [8])local_588) {
        operator_delete((void *)local_598,(ulong)(local_588._0_8_ + 1));
      }
      if (local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_158.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_158.m_shaders[0].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      pDVar25 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_378 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_370);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_370,"Format: ",8);
      tcu::operator<<((ostream *)auStack_370,
                      *(TextureFormat *)
                       ((long)&((TextureFormat *)(&pDVar25->m_size + 1))->order + local_6d0));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_370);
      std::ios_base::~ios_base(local_300);
      local_378 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_370);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_370,"Size: ",6);
      tcu::operator<<((ostream *)auStack_370,
                      (Vector<int,_2> *)((long)(pDVar25->m_size).m_data + local_6d0));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_370);
      std::ios_base::~ios_base(local_300);
      local_378 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_370);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_370,"Render: ",8);
      uVar46 = (ulong)*(byte *)((long)(pDVar25->m_size).m_data + local_6d0 + -4);
      pcVar44 = "false";
      if (uVar46 != 0) {
        pcVar44 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_370,pcVar44,uVar46 ^ 5);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_370);
      std::ios_base::~ios_base(local_300);
      tcu::TestLog::endSection((TestLog *)local_648._0_8_);
      local_5a0 = local_5a0 + 1;
      local_6d0 = local_6d0 + 0x80;
    } while (local_5a0 <
             (int)((ulong)((long)(drawBuffers->
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(drawBuffers->
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 7));
  }
  tcu::TestLog::endSection((TestLog *)local_618._0_8_);
  if (((((local_5e0->enableBlend).m_ptr != (bool *)0x0) ||
       ((local_5e0->blendEq).m_ptr !=
        (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
        0x0)) ||
      ((local_5e0->blendFunc).m_ptr !=
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0)) || ((local_5e0->colorMask).m_ptr != (Vector<bool,_4> *)0x0)) {
    local_378 = (undefined1  [8])local_368;
    local_368._0_4_ = 229.44653;
    local_368._4_2_ = 0x6d6f;
    local_368[6] = 'm';
    local_368[7] = 'o';
    local_368[8] = 'n';
    local_368._9_2_ = 0x7453;
    local_368[0xb] = 'a';
    local_368._12_2_ = 0x6574;
    auStack_370._0_4_ = sRGB;
    auStack_370._4_4_ = SNORM_INT8;
    local_368[0xe] = '\0';
    local_598 = (undefined1  [8])local_588;
    local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x1c;
    local_598 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_598,(ulong)&local_158);
    local_588._0_8_ =
         local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    builtin_strncpy((char *)((long)local_598 + 0xc),"mmon ble",8);
    builtin_strncpy((char *)((long)local_598 + 0x14),"nd state",8);
    *(undefined8 *)local_598 = 0x6573207473726946;
    builtin_strncpy((char *)((long)local_598 + 8),"t common",8);
    TStack_590 = (TextureFormat)
                 local_158.m_shaders[0].
                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    *(char *)((long)local_598 +
             (long)local_158.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)local_480,log,(string *)local_378,(string *)local_598);
    if (local_598 != (undefined1  [8])local_588) {
      operator_delete((void *)local_598,(ulong)(local_588._0_8_ + 1));
    }
    if (local_378 != (undefined1  [8])local_368) {
      operator_delete((void *)local_378,
                      CONCAT17(local_368[7],
                               CONCAT16(local_368[6],CONCAT24(local_368._4_2_,local_368._0_4_))) + 1
                     );
    }
    logBlendState(log,local_5e0);
    tcu::TestLog::endSection((TestLog *)local_480);
  }
  pDVar25 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar25) >> 7)) {
    lVar50 = 0x18;
    lVar43 = 0;
    do {
      if (((*(long *)((long)(pDVar25->m_size).m_data + lVar50 + -4) != 0) ||
          (*(long *)((long)&((TextureFormat *)(&pDVar25->m_size + 1))->type + lVar50) != 0)) ||
         ((*(long *)((long)(&pDVar25->m_size + 5) + lVar50 + 4) != 0 ||
          (*(long *)((long)(&pDVar25->m_size + 10) + lVar50 + 4) != 0)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
        std::ostream::operator<<((ostringstream *)local_378,(int)lVar43);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
        std::ios_base::~ios_base(local_308);
        pTVar24 = (TextureFormat *)
                  std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x1ccbffc);
        local_598 = (undefined1  [8])local_588;
        TVar47 = (TextureFormat)(pTVar24 + 2);
        if (*pTVar24 == TVar47) {
          local_588._0_8_ = *(undefined8 *)TVar47;
          local_588._8_8_ = pTVar24[3];
        }
        else {
          local_588._0_8_ = *(undefined8 *)TVar47;
          local_598 = (undefined1  [8])*pTVar24;
        }
        TStack_590 = pTVar24[1];
        *pTVar24 = TVar47;
        pTVar24[1].order = R;
        pTVar24[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar24[2].order = R;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
        std::ostream::operator<<((ostringstream *)local_378,(int)lVar43);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
        std::ios_base::~ios_base(local_308);
        plVar26 = (long *)std::__cxx11::string::replace((ulong)local_618,0,(char *)0x0,0x1ccc00c);
        psVar38 = (size_type *)(plVar26 + 2);
        if ((size_type *)*plVar26 == psVar38) {
          local_6a8 = (undefined1  [8])*psVar38;
          aStack_6a0.m_align = plVar26[3];
          local_6b8 = (undefined1  [8])(local_6b8 + 0x10);
        }
        else {
          local_6a8 = (undefined1  [8])*psVar38;
          local_6b8 = (undefined1  [8])*plVar26;
        }
        aStack_6b0 = *(anon_union_8_2_d0736028_for_Maybe<bool>_2 *)(plVar26 + 1);
        *plVar26 = (long)psVar38;
        plVar26[1] = 0;
        *(undefined1 *)(plVar26 + 2) = 0;
        pTVar24 = (TextureFormat *)std::__cxx11::string::append(local_6b8);
        TVar47 = (TextureFormat)(pTVar24 + 2);
        if (*pTVar24 == TVar47) {
          local_470._M_allocated_capacity = *(undefined8 *)TVar47;
          local_470._8_8_ = pTVar24[3];
          local_480 = (undefined1  [8])&local_470;
        }
        else {
          local_470._M_allocated_capacity = *(undefined8 *)TVar47;
          local_480 = (undefined1  [8])*pTVar24;
        }
        local_478 = pTVar24[1];
        *pTVar24 = TVar47;
        pTVar24[1].order = R;
        pTVar24[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar24[2].order = R;
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)local_648,log,(string *)local_598,(string *)local_480);
        if (local_480 != (undefined1  [8])&local_470) {
          operator_delete((void *)local_480,(ulong)(local_470._M_allocated_capacity + 1));
        }
        if (local_6b8 != (undefined1  [8])(local_6b8 + 0x10)) {
          operator_delete((void *)local_6b8,(long)local_6a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_ != &local_608) {
          operator_delete((void *)local_618._0_8_,local_608._M_allocated_capacity + 1);
        }
        if (local_598 != (undefined1  [8])local_588) {
          operator_delete((void *)local_598,(ulong)(local_588._0_8_ + 1));
        }
        if (local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_158.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_158.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_158.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        logBlendState(log,(BlendState *)
                          ((long)(((drawBuffers->
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar50 + -4));
        tcu::TestLog::endSection((TestLog *)local_648._0_8_);
      }
      lVar43 = lVar43 + 1;
      pDVar25 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar50 = lVar50 + 0x80;
    } while (lVar43 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar25) >> 7));
  }
  if ((((postCommonBlendState->enableBlend).m_ptr != (bool *)0x0) ||
      ((postCommonBlendState->blendEq).m_ptr !=
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)0x0
      )) || (((postCommonBlendState->blendFunc).m_ptr !=
              (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
               *)0x0 || ((postCommonBlendState->colorMask).m_ptr != (Vector<bool,_4> *)0x0)))) {
    local_378 = (undefined1  [8])local_368;
    local_368._0_4_ = 7.714757e+31;
    local_368._4_2_ = 0x6f43;
    local_368[6] = 'm';
    local_368[7] = 'm';
    local_368[8] = 'o';
    local_368._9_2_ = 0x536e;
    local_368[0xb] = 't';
    local_368._12_2_ = 0x7461;
    local_368[0xe] = 'e';
    auStack_370._0_4_ = sRGBA;
    auStack_370._4_4_ = SNORM_INT8;
    local_368[0xf] = '\0';
    local_598 = (undefined1  [8])local_588;
    local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x1c;
    local_598 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_598,(ulong)&local_158);
    local_588._0_8_ =
         local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    builtin_strncpy((char *)((long)local_598 + 0xc),"mmon ble",8);
    builtin_strncpy((char *)((long)local_598 + 0x14),"nd state",8);
    *(undefined8 *)local_598 = 0x6573207265746641;
    builtin_strncpy((char *)((long)local_598 + 8),"t common",8);
    TStack_590 = (TextureFormat)
                 local_158.m_shaders[0].
                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    *(char *)((long)local_598 +
             (long)local_158.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)local_480,log,(string *)local_378,(string *)local_598);
    if (local_598 != (undefined1  [8])local_588) {
      operator_delete((void *)local_598,(ulong)(local_588._0_8_ + 1));
    }
    if (local_378 != (undefined1  [8])local_368) {
      operator_delete((void *)local_378,
                      CONCAT17(local_368[7],
                               CONCAT16(local_368[6],CONCAT24(local_368._4_2_,local_368._0_4_))) + 1
                     );
    }
    logBlendState(log,postCommonBlendState);
    tcu::TestLog::endSection((TestLog *)local_480);
  }
  local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_158,
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 7);
  (*pFVar22->bindFramebuffer)(0x8d40,local_1a0.m_object);
  pDVar25 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar25) >> 7)) {
    lVar43 = 0x18;
    lVar51 = 0xc;
    lVar50 = 0;
    do {
      dVar19 = glu::getInternalFormat
                         (*(TextureFormat *)((long)(pDVar25->m_size).m_data + lVar51 + -4));
      GVar42 = (int)lVar50 + 0x8ce0;
      *(GLenum *)
       ((long)local_158.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start + lVar50 * 4) = GVar42;
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)local_378,
                 (TextureFormat *)((long)(pDVar25->m_size).m_data + lVar51 + -4),
                 *(int *)((long)(&pDVar25->m_size + -2) + 4 + lVar51),
                 *(int *)((long)(&pDVar25->m_size + -1) + lVar51),1);
      *(undefined4 *)
       ((long)((local_1b8.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                _M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar43 + -0x10) =
           local_368._0_4_;
      pTVar24 = (TextureFormat *)
                ((long)(&(local_1b8.
                          super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_size + -3) + 4 + lVar43);
      pTVar24->order = local_378._0_4_;
      pTVar24->type = local_378._4_4_;
      pTVar24[1].order = auStack_370._0_4_;
      pTVar24[1].type = auStack_370._4_4_;
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
                ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)
                 ((long)((local_1b8.
                          super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar43 + -8),
                 (ArrayBuffer<unsigned_char,_1UL,_1UL> *)(local_368 + 8));
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_378);
      (*pFVar22->bindRenderbuffer)
                (0x8d41,local_180.m_objects.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar50]);
      (*pFVar22->renderbufferStorage)
                (0x8d41,dVar19,*(GLsizei *)((long)(&pDVar25->m_size + -2) + 4 + lVar51),
                 *(GLsizei *)((long)(&pDVar25->m_size + -1) + lVar51));
      (*pFVar22->framebufferRenderbuffer)
                (0x8d40,GVar42,0x8d41,
                 local_180.m_objects.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar50]);
      GVar42 = (*pFVar22->getError)();
      glu::checkError(GVar42,"Failed to create renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                      ,0x1a2);
      lVar50 = lVar50 + 1;
      pDVar25 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar43 = lVar43 + 0x28;
      lVar51 = lVar51 + 0x80;
    } while (lVar50 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar25) >> 7));
  }
  (*pFVar22->drawBuffers)
            ((GLsizei)((ulong)((long)local_158.m_shaders[0].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_158.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (GLenum *)
             local_158.m_shaders[0].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  pDVar25 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar25) >> 7)) {
    lVar43 = 0xc;
    local_1c8 = 0;
    local_1c0 = 0;
    local_6d0 = 0;
    do {
      pTVar15 = local_1b8.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pTVar14 = local_1b8.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_5a0 = lVar43;
      tcu::getTextureFormatInfo
                ((TextureFormatInfo *)local_378,
                 (TextureFormat *)((long)(pDVar25->m_size).m_data + lVar43 + -4));
      iVar49 = (int)((ulong)((long)pTVar15 - (long)pTVar14) >> 3) * -0x33333333;
      iVar40 = (int)local_1c0 + iVar49;
      iVar18 = (int)local_6d0;
      TVar20 = tcu::getTextureChannelClass
                         (*(ChannelType *)((long)(pDVar25->m_size).m_data + local_5a0));
      local_6d0 = local_6d0 + 1;
      if (TVar20 < TEXTURECHANNELCLASS_LAST) {
        pTVar52 = (TextureLevel *)((long)(pTVar14->m_size).m_data + local_1c8 + -8);
        fVar56 = (float)iVar49;
        fVar55 = (float)(int)local_6d0 / fVar56;
        fVar53 = (float)iVar40 / fVar56;
        fVar54 = (float)((iVar18 + iVar49 / 2) % iVar49) / fVar56;
        fVar56 = (float)((iVar49 / 2 + iVar40) % iVar49 + 1) / fVar56;
        switch(TVar20) {
        case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
          local_480._4_4_ =
               ((float)CONCAT13(local_368[7],CONCAT12(local_368[6],local_368._4_2_)) -
               (float)local_378._4_4_) * fVar54 + (float)local_378._4_4_;
          local_480._0_4_ =
               ((float)local_368._0_4_ - (float)local_378._0_4_) * fVar55 + (float)local_378._0_4_;
          local_478.type =
               (ChannelType)
               (((float)CONCAT13(local_368[0xf],CONCAT12(local_368[0xe],local_368._12_2_)) -
                (float)auStack_370._4_4_) * fVar56 + (float)auStack_370._4_4_);
          local_478.order =
               (ChannelOrder)
               (((float)CONCAT13(local_368[0xb],CONCAT21(local_368._9_2_,local_368[8])) -
                (float)auStack_370._0_4_) * fVar53 + (float)auStack_370._0_4_);
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_598,pTVar52);
          tcu::clear((PixelBufferAccess *)local_598,(Vec4 *)local_480);
          (*pFVar22->clearBufferfv)(0x1800,iVar18,(GLfloat *)local_480);
          break;
        case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
          local_480._4_4_ =
               fVar54 * (float)CONCAT13(local_368[7],CONCAT12(local_368[6],local_368._4_2_));
          local_480._0_4_ = fVar55 * (float)local_368._0_4_;
          local_478.type =
               (ChannelType)
               (fVar56 * (float)CONCAT13(local_368[0xf],CONCAT12(local_368[0xe],local_368._12_2_)));
          local_478.order =
               (ChannelOrder)
               (fVar53 * (float)CONCAT13(local_368[0xb],CONCAT21(local_368._9_2_,local_368[8])));
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_598,pTVar52);
          tcu::clear((PixelBufferAccess *)local_598,(Vec4 *)local_480);
          (*pFVar22->clearBufferfv)(0x1800,iVar18,(GLfloat *)local_480);
          break;
        case TEXTURECHANNELCLASS_SIGNED_INTEGER:
          local_480._4_4_ =
               (int)(((float)CONCAT13(local_368[7],CONCAT12(local_368[6],local_368._4_2_)) -
                     (float)local_378._4_4_) * fVar54 + (float)local_378._4_4_);
          local_480._0_4_ =
               (int)(((float)local_368._0_4_ - (float)local_378._0_4_) * fVar55 +
                    (float)local_378._0_4_);
          local_478.type =
               (int)(((float)CONCAT13(local_368[0xf],CONCAT12(local_368[0xe],local_368._12_2_)) -
                     (float)auStack_370._4_4_) * fVar56 + (float)auStack_370._4_4_);
          local_478.order =
               (int)(((float)CONCAT13(local_368[0xb],CONCAT21(local_368._9_2_,local_368[8])) -
                     (float)auStack_370._0_4_) * fVar53 + (float)auStack_370._0_4_);
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_598,pTVar52);
          tcu::clear((PixelBufferAccess *)local_598,(IVec4 *)local_480);
          (*pFVar22->clearBufferiv)(0x1800,iVar18,(GLint *)local_480);
          break;
        case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
          local_480._4_4_ =
               (ChannelType)
               (long)(fVar54 * (float)CONCAT13(local_368[7],CONCAT12(local_368[6],local_368._4_2_)))
          ;
          local_480._0_4_ = (ChannelOrder)(long)(fVar55 * (float)local_368._0_4_);
          local_478.type =
               (ChannelType)
               (long)(fVar56 * (float)CONCAT13(local_368[0xf],
                                               CONCAT12(local_368[0xe],local_368._12_2_)));
          local_478.order =
               (ChannelOrder)
               (long)(fVar53 * (float)CONCAT13(local_368[0xb],CONCAT21(local_368._9_2_,local_368[8])
                                              ));
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_598,pTVar52);
          tcu::clear((PixelBufferAccess *)local_598,(UVec4 *)local_480);
          (*pFVar22->clearBufferuiv)(0x1800,iVar18,(GLuint *)local_480);
          break;
        case TEXTURECHANNELCLASS_FLOATING_POINT:
          local_480._4_4_ = fVar54 * 2000.0 + -1000.0;
          local_480._0_4_ = fVar55 * 2000.0 + -1000.0;
          local_478.type = (ChannelType)(fVar56 * 2000.0 + -1000.0);
          local_478.order = (ChannelOrder)(fVar53 * 2000.0 + -1000.0);
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_598,pTVar52);
          tcu::clear((PixelBufferAccess *)local_598,(Vec4 *)local_480);
          (*pFVar22->clearBufferfv)(0x1800,iVar18,(GLfloat *)local_480);
        }
      }
      GVar42 = (*pFVar22->getError)();
      glu::checkError(GVar42,"Failed to clear renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                      ,0x183);
      pDVar25 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_1c0 = local_1c0 + -1;
      local_1c8 = local_1c8 + 0x28;
      lVar43 = local_5a0 + 0x80;
    } while (local_6d0 <
             (int)((ulong)((long)(drawBuffers->
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar25) >> 7))
    ;
  }
  (*pFVar22->bindRenderbuffer)(0x8d41,0);
  (*pFVar22->bindFramebuffer)(0x8d40,0);
  if ((TextureFormat)
      local_158.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (TextureFormat)0x0) {
    operator_delete(local_158.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar18 = (*local_5a8->_vptr_RenderContext[3])();
  pFVar22 = (Functions *)CONCAT44(extraout_var_00,iVar18);
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  uStack_4d0 = uStack_4d0 & 0xffffff00;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(local_598,0,0xac);
  CVar21.super_ApiType.m_bits = (ApiType)(*local_5a8->_vptr_RenderContext[2])();
  bVar16 = glu::contextSupports(CVar21,(ApiType)0x23);
  local_368._16_8_ = auStack_370;
  auStack_370 = (undefined1  [8])((ulong)auStack_370 & 0xffffffff00000000);
  local_368._0_4_ = 0;
  local_368._4_2_ = 0;
  local_368[6] = '\0';
  local_368[7] = '\0';
  local_368[8] = (undefined1)local_368._16_8_;
  local_368._9_2_ = (undefined2)((ulong)local_368._16_8_ >> 8);
  local_368[0xb] = (undefined1)((ulong)local_368._16_8_ >> 0x18);
  local_368._12_2_ = (undefined2)((ulong)local_368._16_8_ >> 0x20);
  local_368[0xe] = (undefined1)((ulong)local_368._16_8_ >> 0x30);
  local_368[0xf] = (undefined1)((ulong)local_368._16_8_ >> 0x38);
  local_350 = 0;
  pcVar27 = glu::getGLSLVersionDeclaration(bVar16 | GLSL_VERSION_310_ES);
  local_6b8 = (undefined1  [8])(local_6b8 + 0x10);
  local_618._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x11;
  local_6b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_6b8,(ulong)local_618);
  local_6a8 = (undefined1  [8])local_618._0_8_;
  builtin_strncpy((char *)local_6b8,"GLSL_VERSION_DECL",0x11);
  aStack_6b0.m_align = local_618._0_8_;
  *(char *)((long)local_6b8 + local_618._0_8_) = '\0';
  pmVar28 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_378,(key_type *)local_6b8);
  pcVar44 = (char *)pmVar28->_M_string_length;
  strlen(pcVar27);
  std::__cxx11::string::_M_replace((ulong)pmVar28,0,pcVar44,(ulong)pcVar27);
  if (local_6b8 != (undefined1  [8])(local_6b8 + 0x10)) {
    operator_delete((void *)local_6b8,(long)local_6a8 + 1);
  }
  local_5d8._0_8_ = &local_5c8;
  local_4a8._M_dataplus._M_p = (pointer)0xbb;
  paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)local_5d8,(ulong)&local_4a8);
  _Var12._M_p = local_4a8._M_dataplus._M_p;
  local_5c8 = local_4a8._M_dataplus._M_p;
  local_5d8._0_8_ = paVar29;
  memcpy(paVar29,
         "${GLSL_VERSION_DECL}\nlayout(location=0) in highp vec2 i_coord;\nout highp vec2 v_color;\nvoid main (void)\n{\n\tv_color = 0.5 * (vec2(1.0) + i_coord);\n\tgl_Position = vec4(i_coord, 0.0, 1.0);\n}"
         ,0xbb);
  local_5d8._8_8_ = _Var12._M_p;
  paVar29->_M_local_buf[(long)_Var12._M_p] = '\0';
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_618,(string *)local_5d8);
  tcu::StringTemplate::specialize
            ((string *)local_6b8,(StringTemplate *)local_618,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_378);
  local_648._0_8_ = (ulong)(uint)local_648._4_4_ << 0x20;
  local_648._8_8_ = &aStack_630;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_648 + 8),local_6b8,(char *)((long)local_6b8 + aStack_6b0.m_align));
  if (local_6b8 != (undefined1  [8])(local_6b8 + 0x10)) {
    operator_delete((void *)local_6b8,(long)local_6a8 + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_5c8) {
    operator_delete((void *)local_5d8._0_8_,(long)local_5c8 + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_598 + (local_648._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_648 + 8));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
  CVar21.super_ApiType.m_bits = (ApiType)(*local_5a8->_vptr_RenderContext[2])();
  bVar16 = glu::contextSupports(CVar21,(ApiType)0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_378,"${GLSL_VERSION_DECL}\n",0x15);
  local_6b8 = (undefined1  [8])0x0;
  pbVar33 = (postCommonBlendState->enableBlend).m_ptr;
  if (pbVar33 != (bool *)0x0) {
    local_6b8 = (undefined1  [8])(local_6b8 + 8);
    aStack_6b0.m_data[0] = (deUint8  [1])(deUint8  [1])*pbVar33;
  }
  local_6a8 = (undefined1  [8])0x0;
  pEVar5 = (postCommonBlendState->blendEq).m_ptr;
  if (pEVar5 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)0x0) {
    local_6a8 = (undefined1  [8])&aStack_6a0;
    aStack_6a0.m_data[0] = pEVar5->m_isFirst;
    aStack_6a0._8_8_ = aStack_6a0.m_data + 0x10;
    if (pEVar5->m_isFirst == true) {
      aStack_6a0._16_4_ = ((pEVar5->field_1).m_second)->rgb;
    }
    else {
      aStack_6a0._16_8_ = *(pEVar5->field_1).m_second;
    }
  }
  local_688 = (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
               *)0x0;
  pEVar6 = (postCommonBlendState->blendFunc).m_ptr;
  if (pEVar6 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    local_688 = (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)local_680;
    local_680[0] = pEVar6->m_isFirst;
    local_680._8_8_ = local_680 + 0x10;
    pBVar7 = (pEVar6->field_1).m_first;
    if ((bool)local_680[0] == true) {
      local_680._16_8_ = *pBVar7;
    }
    else {
      local_680._16_8_ = *pBVar7;
      local_680._24_8_ = pBVar7[1];
    }
  }
  local_660 = (Vector<bool,_4> *)0x0;
  pVVar8 = (postCommonBlendState->colorMask).m_ptr;
  if (pVVar8 != (Vector<bool,_4> *)0x0) {
    local_660 = local_658;
    lVar43 = 0;
    do {
      local_658[0].m_data[lVar43] = pVVar8->m_data[lVar43];
      lVar43 = lVar43 + 1;
    } while (lVar43 != 4);
  }
  bVar17 = requiresAdvancedBlendEq(local_5e0,(BlendState *)local_6b8,drawBuffers);
  if (local_688 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_688->m_isFirst = true;
    (local_688->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_6a8 != (undefined1  [8])0x0) {
    *(deUint8 *)local_6a8 = '\x01';
    pdVar1 = (deUint8 *)((long)local_6a8 + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  if (bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_378,"${GLSL_EXTENSION}",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_378,"layout(blend_support_all_equations) out;\n",0x29);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_378,"in highp vec2 v_color;\n",0x17);
  pDVar25 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar25) >> 7)) {
    lVar50 = 0x10;
    lVar43 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_378,"layout(location=",0x10);
      poVar30 = (ostream *)std::ostream::operator<<((ostream *)local_378,(int)lVar43);
      std::__ostream_insert<char,std::char_traits<char>>(poVar30,") out highp ",0xc);
      TVar20 = tcu::getTextureChannelClass
                         (*(ChannelType *)((long)(pDVar25->m_size).m_data + lVar50 + -4));
      if (TVar20 < TEXTURECHANNELCLASS_LAST) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378,&DAT_01ccb9d0 + *(int *)(&DAT_01ccb9d0 + (ulong)TVar20 * 4),
                   *(long *)(&DAT_01ccb9e8 + (ulong)TVar20 * 8));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378," o_drawBuffer",0xd);
      poVar30 = (ostream *)std::ostream::operator<<((ostream *)local_378,(int)lVar43);
      std::__ostream_insert<char,std::char_traits<char>>(poVar30,";\n",2);
      lVar43 = lVar43 + 1;
      pDVar25 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar50 = lVar50 + 0x80;
    } while (lVar43 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar25) >> 7));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"{\n",2);
  pDVar25 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar25) >> 7)) {
    lVar43 = 0x10;
    lVar50 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"\to_drawBuffer",0xd);
      uVar36 = (uint)lVar50;
      std::ostream::operator<<((ostream *)local_378,uVar36);
      TVar20 = tcu::getTextureChannelClass
                         (*(ChannelType *)((long)(pDVar25->m_size).m_data + lVar43 + -4));
      switch(TVar20) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378," = vec4(",8);
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)[uVar36 & 3];
        sVar31 = strlen(pcVar44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,", ",2);
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)[uVar36 + 1 & 3];
        sVar31 = strlen(pcVar44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,", ",2);
        uVar35 = uVar36 + 5;
        if (-1 < (int)(uVar36 + 2)) {
          uVar35 = uVar36 + 2;
        }
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)
                  [(int)((uVar36 - (uVar35 & 0xfffffffc)) + 2)];
        sVar31 = strlen(pcVar44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,", ",2);
        uVar35 = uVar36 + 6;
        if (-1 < (int)(uVar36 + 3)) {
          uVar35 = uVar36 + 3;
        }
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)
                  [(int)((uVar36 - (uVar35 & 0xfffffffc)) + 3)];
        sVar31 = strlen(pcVar44);
        lVar51 = 3;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        pcVar44 = ");\n";
        goto LAB_01696f8f;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378," = ivec4(int(",0xd)
        ;
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)[uVar36 & 3];
        sVar31 = strlen(pcVar44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"), int(",7);
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)[uVar36 + 1 & 3];
        sVar31 = strlen(pcVar44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"), int(",7);
        uVar35 = uVar36 + 5;
        if (-1 < (int)(uVar36 + 2)) {
          uVar35 = uVar36 + 2;
        }
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)
                  [(int)((uVar36 - (uVar35 & 0xfffffffc)) + 2)];
        sVar31 = strlen(pcVar44);
        lVar51 = 7;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        pcVar44 = "), int(";
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_378," = uvec4(uint(",0xe);
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)[uVar36 & 3];
        sVar31 = strlen(pcVar44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"), uint(",8);
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)[uVar36 + 1 & 3];
        sVar31 = strlen(pcVar44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"), uint(",8);
        uVar35 = uVar36 + 5;
        if (-1 < (int)(uVar36 + 2)) {
          uVar35 = uVar36 + 2;
        }
        pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)
                  [(int)((uVar36 - (uVar35 & 0xfffffffc)) + 2)];
        sVar31 = strlen(pcVar44);
        lVar51 = 8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
        pcVar44 = "), uint(";
        break;
      default:
        goto switchD_01696ca3_default;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,lVar51);
      uVar35 = uVar36 + 6;
      if (-1 < (int)(uVar36 + 3)) {
        uVar35 = uVar36 + 3;
      }
      pcVar44 = (&PTR_anon_var_dwarf_4077e69_021ad3a0)[(int)((uVar36 - (uVar35 & 0xfffffffc)) + 3)];
      sVar31 = strlen(pcVar44);
      lVar51 = 4;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,sVar31);
      pcVar44 = "));\n";
LAB_01696f8f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,pcVar44,lVar51);
switchD_01696ca3_default:
      lVar50 = lVar50 + 1;
      pDVar25 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar43 = lVar43 + 0x80;
    } while (lVar50 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar25) >> 7));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,"}",1);
  local_608._8_8_ = local_618 + 8;
  stack0xfffffffffffff9f0 = (pointer)((ulong)uStack_60c << 0x20);
  local_608._M_allocated_capacity = 0;
  local_5f0 = (pointer)0x0;
  local_5f8 = (_Base_ptr)local_608._8_8_;
  pcVar27 = glu::getGLSLVersionDeclaration(bVar16 | GLSL_VERSION_310_ES);
  paVar29 = &local_4a8.field_2;
  local_1e8._0_8_ = 0x11;
  local_4a8._M_dataplus._M_p = (pointer)paVar29;
  local_4a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4a8,(ulong)&local_1e8);
  local_4a8.field_2._M_allocated_capacity._0_6_ = local_1e8._0_6_;
  local_4a8.field_2._M_allocated_capacity._6_2_ = local_1e8._6_2_;
  builtin_strncpy(local_4a8._M_dataplus._M_p,"GLSL_VERSION_DECL",0x11);
  local_4a8._M_string_length = local_1e8._0_8_;
  local_4a8._M_dataplus._M_p[local_1e8._0_8_] = '\0';
  pmVar28 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_618,&local_4a8);
  pcVar44 = (char *)pmVar28->_M_string_length;
  strlen(pcVar27);
  std::__cxx11::string::_M_replace((ulong)pmVar28,0,pcVar44,(ulong)pcVar27);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar29) {
    operator_delete(local_4a8._M_dataplus._M_p,
                    CONCAT26(local_4a8.field_2._M_allocated_capacity._6_2_,
                             local_4a8.field_2._M_allocated_capacity._0_6_) + 1);
  }
  local_4a8.field_2._M_allocated_capacity._0_6_ = 0x455f4c534c47;
  local_4a8.field_2._M_allocated_capacity._6_2_ = 0x5458;
  local_4a8.field_2._8_6_ = 0x4e4f49534e45;
  local_4a8._M_string_length = 0xe;
  local_4a8.field_2._M_local_buf[0xe] = '\0';
  local_4a8._M_dataplus._M_p = (pointer)paVar29;
  pmVar28 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_618,&local_4a8);
  pcVar44 = "#extension GL_KHR_blend_equation_advanced : require\n";
  if (bVar16) {
    pcVar44 = "\n";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar28,0,(char *)pmVar28->_M_string_length,(ulong)pcVar44);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar29) {
    operator_delete(local_4a8._M_dataplus._M_p,
                    CONCAT26(local_4a8.field_2._M_allocated_capacity._6_2_,
                             local_4a8.field_2._M_allocated_capacity._0_6_) + 1);
  }
  std::__cxx11::stringbuf::str();
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_1e8,&local_3a8);
  tcu::StringTemplate::specialize
            (&local_4a8,(StringTemplate *)&local_1e8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_618);
  local_5d8._0_4_ = 1;
  local_5d8._8_8_ = &aStack_5c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_5d8 + 8),local_4a8._M_dataplus._M_p,
             (undefined1 *)(local_4a8._M_string_length + (long)local_4a8._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar29) {
    operator_delete(local_4a8._M_dataplus._M_p,
                    CONCAT26(local_4a8.field_2._M_allocated_capacity._6_2_,
                             local_4a8.field_2._M_allocated_capacity._0_6_) + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_618);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
  std::ios_base::~ios_base(local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_598 + (local_5d8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_5d8 + 8));
  lVar43 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_480 + lVar43),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_598 + lVar43));
    lVar43 = lVar43 + 0x18;
  } while (lVar43 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &local_3f0,&local_508);
  BStack_3d8.src = local_4f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3d0,&local_4e8);
  local_3b8 = (bool)(undefined1)uStack_4d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._8_8_ != &aStack_5c0) {
    operator_delete((void *)local_5d8._8_8_,aStack_5c0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._8_8_ != &aStack_630) {
    operator_delete((void *)local_648._8_8_,aStack_630._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_508);
  lVar43 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_598 + lVar43));
    lVar43 = lVar43 + -0x18;
  } while (lVar43 != -0x18);
  glu::ShaderProgram::ShaderProgram(&local_158,pFVar22,(ProgramSources *)local_480);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &local_3f0);
  lVar43 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_480 + lVar43));
    lVar43 = lVar43 + -0x18;
  } while (lVar43 != -0x18);
  pDVar25 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  GVar2 = (pDVar25->m_size).m_data[0];
  GVar3 = (pDVar25->m_size).m_data[1];
  local_6b8 = (undefined1  [8])0x0;
  pbVar33 = (postCommonBlendState->enableBlend).m_ptr;
  if (pbVar33 != (bool *)0x0) {
    local_6b8 = (undefined1  [8])(local_6b8 + 8);
    aStack_6b0.m_data[0] = (deUint8  [1])(deUint8  [1])*pbVar33;
  }
  local_6a8 = (undefined1  [8])0x0;
  pEVar5 = (postCommonBlendState->blendEq).m_ptr;
  if (pEVar5 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)0x0) {
    local_6a8 = (undefined1  [8])&aStack_6a0;
    aStack_6a0.m_data[0] = pEVar5->m_isFirst;
    aStack_6a0._8_8_ = aStack_6a0.m_data + 0x10;
    if (pEVar5->m_isFirst == true) {
      aStack_6a0._16_4_ = ((pEVar5->field_1).m_second)->rgb;
    }
    else {
      aStack_6a0._16_8_ = *(pEVar5->field_1).m_second;
    }
  }
  local_688 = (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
               *)0x0;
  pEVar6 = (postCommonBlendState->blendFunc).m_ptr;
  if (pEVar6 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    local_688 = (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)local_680;
    local_680[0] = pEVar6->m_isFirst;
    local_680._8_8_ = local_680 + 0x10;
    pBVar7 = (pEVar6->field_1).m_first;
    if ((bool)local_680[0] == true) {
      local_680._16_8_ = *pBVar7;
    }
    else {
      local_680._16_8_ = *pBVar7;
      local_680._24_8_ = pBVar7[1];
    }
  }
  local_660 = (Vector<bool,_4> *)0x0;
  pVVar8 = (postCommonBlendState->colorMask).m_ptr;
  if (pVVar8 != (Vector<bool,_4> *)0x0) {
    local_660 = local_658;
    lVar43 = 0;
    do {
      local_658[0].m_data[lVar43] = pVVar8->m_data[lVar43];
      lVar43 = lVar43 + 1;
    } while (lVar43 != 4);
  }
  bVar16 = requiresAdvancedBlendEq(local_5e0,(BlendState *)local_6b8,drawBuffers);
  if (local_688 !=
      (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
       *)0x0) {
    local_688->m_isFirst = true;
    (local_688->field_1).m_first = (BlendFunc *)0x0;
  }
  if (local_6a8 != (undefined1  [8])0x0) {
    *(deUint8 *)local_6a8 = '\x01';
    pdVar1 = (deUint8 *)((long)local_6a8 + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
  }
  local_3a8._M_dataplus._M_p = (pointer)0x0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3a8,
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 7);
  uVar36 = (uint)(local_3a8._M_string_length - (long)local_3a8._M_dataplus._M_p >> 2);
  if (0 < (int)uVar36) {
    pDVar25 = (drawBuffers->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar46 = 0;
    do {
      GVar42 = (int)uVar46 + 0x8ce0;
      if (pDVar25->m_render == false) {
        GVar42 = 0;
      }
      *(GLenum *)((long)local_3a8._M_dataplus._M_p + uVar46 * 4) = GVar42;
      uVar46 = uVar46 + 1;
      pDVar25 = pDVar25 + 1;
    } while ((uVar36 & 0x7fffffff) != uVar46);
  }
  glu::operator<<(log,&local_158);
  (*pFVar22->viewport)(0,0,GVar2,GVar3);
  (*pFVar22->useProgram)(local_158.m_program.m_program);
  (*pFVar22->bindFramebuffer)(0x8d40,local_1a0.m_object);
  setCommonBlendState(pFVar22,local_5e0);
  pDVar25 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar25) >> 7)) {
    lVar50 = 0x18;
    lVar43 = 0;
    do {
      pcVar44 = *(char **)((long)(pDVar25->m_size).m_data + lVar50 + -4);
      GVar41 = (GLuint)lVar43;
      if (pcVar44 != (char *)0x0) {
        pp_Var32 = &pFVar22->disablei;
        if (*pcVar44 != '\0') {
          pp_Var32 = &pFVar22->enablei;
        }
        (**pp_Var32)(0xbe2,GVar41);
      }
      pGVar9 = *(GLboolean **)((long)(&pDVar25->m_size + 10) + lVar50 + 4);
      if (pGVar9 != (GLboolean *)0x0) {
        (*pFVar22->colorMaski)(GVar41,*pGVar9,pGVar9[1],pGVar9[2],pGVar9[3]);
      }
      pcVar44 = *(char **)((long)&((TextureFormat *)(&pDVar25->m_size + 1))->type + lVar50);
      if (pcVar44 != (char *)0x0) {
        GVar42 = **(GLenum **)(pcVar44 + 8);
        if (*pcVar44 == '\x01') {
          (*pFVar22->blendEquationi)(GVar41,GVar42);
        }
        else {
          (*pFVar22->blendEquationSeparatei)(GVar41,GVar42,(*(GLenum **)(pcVar44 + 8))[1]);
        }
      }
      pcVar44 = *(char **)((long)(&pDVar25->m_size + 5) + lVar50 + 4);
      if (pcVar44 != (char *)0x0) {
        pGVar10 = *(GLenum **)(pcVar44 + 8);
        if (*pcVar44 == '\x01') {
          (*pFVar22->blendFunci)(GVar41,*pGVar10,pGVar10[1]);
        }
        else {
          (*pFVar22->blendFuncSeparatei)(GVar41,*pGVar10,pGVar10[1],pGVar10[2],pGVar10[3]);
        }
      }
      GVar42 = (*pFVar22->getError)();
      glu::checkError(GVar42,"Failed to set draw buffer specifig blend state.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                      ,0x10e);
      lVar43 = lVar43 + 1;
      pDVar25 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar50 = lVar50 + 0x80;
    } while (lVar43 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar25) >> 7));
  }
  setCommonBlendState(pFVar22,postCommonBlendState);
  (*pFVar22->drawBuffers)
            ((GLsizei)(local_3a8._M_string_length - (long)local_3a8._M_dataplus._M_p >> 2),
             (GLenum *)local_3a8._M_dataplus._M_p);
  if (bVar16) {
    (*pFVar22->blendBarrier)();
  }
  local_378 = (undefined1  [8])((ulong)local_378 & 0xffffffff00000000);
  local_368._0_4_ = 0;
  local_368._4_2_ = 0;
  local_368[6] = '\0';
  local_368[7] = '\0';
  local_368[8] = '\0';
  local_350 = local_350 & 0xffffffff00000000;
  local_348[0].componentType = VTX_COMP_FLOAT;
  local_348[0].convert = VTX_COMP_CONVERT_NONE;
  local_348[0].numComponents = 2;
  local_348[0].numElements = 6;
  local_348[0].stride = 0;
  local_348[0].data = Functional::(anonymous_namespace)::s_quadCoords;
  local_598._0_4_ = R;
  local_598._4_4_ = UNORM_INT32;
  TStack_590.order = L;
  local_588._0_8_ = 0;
  auStack_370 = (undefined1  [8])(local_368 + 8);
  glu::draw(local_5a8,local_158.m_program.m_program,1,(VertexArrayBinding *)local_378,
            (PrimitiveList *)local_598,(DrawUtilCallback *)0x0);
  if (auStack_370 != (undefined1  [8])(local_368 + 8)) {
    operator_delete((void *)auStack_370,
                    CONCAT17(local_368[0xf],
                             CONCAT16(local_368[0xe],
                                      CONCAT24(local_368._12_2_,
                                               CONCAT13(local_368[0xb],
                                                        CONCAT21(local_368._9_2_,local_368[8]))))) +
                    1);
  }
  if (bVar16) {
    (*pFVar22->blendBarrier)();
  }
  (*pFVar22->drawBuffers)(0,(GLenum *)0x0);
  (*pFVar22->bindFramebuffer)(0x8d40,0);
  (*pFVar22->useProgram)(0);
  GVar42 = (*pFVar22->getError)();
  glu::checkError(GVar42,"Failed to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                  ,0x414);
  rr::Renderer::Renderer((Renderer *)&local_1f8);
  rr::PrimitiveList::PrimitiveList(&local_1e8,PRIMITIVETYPE_TRIANGLES,6,0);
  local_5d8._8_8_ = (undefined1 *)0x0;
  aStack_5c0._0_8_ = 0;
  aStack_5c0._8_8_ = 0;
  local_5d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x200000000;
  local_5c8 = Functional::(anonymous_namespace)::s_quadCoords;
  pDVar25 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar25) >> 7)) {
    lVar43 = 4;
    lVar50 = 0;
    do {
      if (pDVar25[lVar50].m_render == true) {
        iVar18 = pDVar25[lVar50].m_size.m_data[0];
        uVar36 = pDVar25[lVar50].m_size.m_data[1];
        local_598._0_4_ = R;
        local_598._4_4_ = SNORM_INT16;
        TStack_590.order = R;
        TStack_590.type = SNORM_INT8;
        local_588._0_8_ = 0x200000001;
        rr::FragmentOperationState::FragmentOperationState
                  ((FragmentOperationState *)(local_588 + 8));
        local_4e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_4e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0x3f8000;
        local_4e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_4cc = 0x3f80000000000000;
        local_4c4 = 0x3f800000;
        local_4c0 = 0;
        local_4bc = 0xffffffff;
        local_588._0_8_ = local_588._0_8_ & 0xffffffff;
        local_524 = 1;
        local_4e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar18;
        uStack_4d0 = uVar36;
        setBlendState((FragmentOperationState *)(local_588 + 8),local_5e0);
        setBlendState((FragmentOperationState *)(local_588 + 8),&pDVar25[lVar50].m_blendState);
        setBlendState((FragmentOperationState *)(local_588 + 8),postCommonBlendState);
        pbVar33 = (postCommonBlendState->enableBlend).m_ptr;
        if (((pbVar33 == (bool *)0x0) &&
            (pbVar33 = pDVar25[lVar50].m_blendState.enableBlend.m_ptr, pbVar33 == (bool *)0x0)) &&
           (pbVar33 = (local_5e0->enableBlend).m_ptr, pbVar33 == (bool *)0x0)) {
          uVar37 = 0;
        }
        else {
          uVar37 = 0;
          if (*pbVar33 != false) {
            uVar37 = local_524;
          }
        }
        local_524 = uVar37;
        TVar20 = tcu::getTextureChannelClass(pDVar25[lVar50].m_format.type);
        if (((TVar20 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) &&
            (TVar20 = tcu::getTextureChannelClass(pDVar25[lVar50].m_format.type),
            TVar20 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) &&
           (TVar20 = tcu::getTextureChannelClass(pDVar25[lVar50].m_format.type),
           TVar20 != TEXTURECHANNELCLASS_FLOATING_POINT)) {
          local_524 = 0;
        }
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)local_618,
                   local_1b8.
                   super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl
                   .super__Vector_impl_data._M_start + lVar50);
        rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
                  ((MultisamplePixelBufferAccess *)local_480,(PixelBufferAccess *)local_618);
        rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
                  ((MultisamplePixelBufferAccess *)local_648);
        rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
                  ((MultisamplePixelBufferAccess *)&local_4a8);
        rr::RenderTarget::RenderTarget
                  ((RenderTarget *)local_378,(MultisamplePixelBufferAccess *)local_480,
                   (MultisamplePixelBufferAccess *)local_648,
                   (MultisamplePixelBufferAccess *)&local_4a8);
        rr::VertexShader::VertexShader((VertexShader *)local_618,1,1);
        local_618._0_8_ = &PTR_shadeVertices_021ad3d0;
        stack0xfffffffffffff9f0->type = GENERICVECTYPE_FLOAT;
        local_5f8->_M_color = _S_red;
        pDVar25 = (drawBuffers->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        rr::FragmentShader::FragmentShader((FragmentShader *)local_480,1,1);
        pDVar48 = pDVar25 + lVar50;
        local_480 = (undefined1  [8])&PTR_shadeFragments_021ad400;
        local_448 = (undefined4)lVar50;
        local_440 = pDVar48->m_render;
        lVar51 = 0;
        do {
          aCStack_43c[lVar51] =
               *(ChannelType *)((long)(pDVar25->m_size).m_data + lVar51 * 4 + lVar43 + -4);
          lVar51 = lVar51 + 1;
        } while (lVar51 == 1);
        local_434 = pDVar48->m_format;
        local_428 = (pointer)0x0;
        pbVar33 = (pDVar48->m_blendState).enableBlend.m_ptr;
        if (pbVar33 != (bool *)0x0) {
          local_420[0] = *pbVar33;
          local_428 = (pointer)local_420;
        }
        local_420._8_8_ = (pointer)0x0;
        pEVar5 = (pDVar48->m_blendState).blendEq.m_ptr;
        if (pEVar5 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                       *)0x0) {
          local_420[0x10] = pEVar5->m_isFirst;
          if ((bool)local_420[0x10] == true) {
            local_400._M_allocated_capacity._0_4_ = ((pEVar5->field_1).m_second)->rgb;
          }
          else {
            local_400._M_allocated_capacity = (size_type)*(pEVar5->field_1).m_second;
          }
          local_420._24_8_ = &local_400;
          local_420._8_8_ = local_420 + 0x10;
        }
        local_400._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        pEVar6 = (pDVar48->m_blendState).blendFunc.m_ptr;
        if (pEVar6 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                       *)0x0) {
          local_3f0._M_local_buf[0] = pEVar6->m_isFirst;
          pBVar7 = (pEVar6->field_1).m_first;
          if ((bool)local_3f0._M_local_buf[0] == true) {
            local_3e0 = *pBVar7;
          }
          else {
            local_3e0 = *pBVar7;
            BStack_3d8 = pBVar7[1];
          }
          local_3f0._8_8_ = &local_3e0;
          local_400._8_8_ = &local_3f0;
        }
        local_3d0._0_8_ = (pointer)0x0;
        pVVar8 = (pDVar48->m_blendState).colorMask.m_ptr;
        if (pVVar8 != (Vector<bool,_4> *)0x0) {
          lVar51 = 0;
          do {
            local_3d0[lVar51 + 8] = pVVar8->m_data[lVar51];
            lVar51 = lVar51 + 1;
          } while (lVar51 != 4);
          local_3d0._0_8_ = local_3d0 + 8;
        }
        *(undefined4 *)local_478 = 0;
        TVar20 = tcu::getTextureChannelClass(local_434.type);
        if (TVar20 < TEXTURECHANNELCLASS_LAST) {
          *(undefined4 *)&(local_460->_M_dataplus)._M_p =
               *(undefined4 *)(&DAT_01ccba10 + (ulong)TVar20 * 4);
        }
        local_4a8._M_string_length = (size_type)local_480;
        local_4a8.field_2._M_allocated_capacity._0_6_ = 0;
        local_4a8.field_2._M_allocated_capacity._6_2_ = 0;
        local_648._0_8_ = local_598;
        local_648._8_8_ = local_378;
        aStack_630._M_allocated_capacity._0_4_ = 1;
        aStack_630._8_8_ = local_5d8;
        local_620 = &local_1e8;
        local_638 = &local_4a8;
        local_4a8._M_dataplus._M_p = (pointer)local_618;
        rr::Renderer::draw((Renderer *)&local_1f8,(DrawCommand *)local_648);
        local_480 = (undefined1  [8])&PTR_shadeFragments_021ad400;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          *(char *)local_400._8_8_ = '\x01';
          pcVar44 = (char *)(local_400._8_8_ + 8);
          pcVar44[0] = '\0';
          pcVar44[1] = '\0';
          pcVar44[2] = '\0';
          pcVar44[3] = '\0';
          pcVar44[4] = '\0';
          pcVar44[5] = '\0';
          pcVar44[6] = '\0';
          pcVar44[7] = '\0';
        }
        if ((pointer)local_420._8_8_ != (pointer)0x0) {
          *(undefined1 *)&((_Alloc_hider *)local_420._8_8_)->_M_p = 1;
          *(size_type *)(local_420._8_8_ + 8) = 0;
        }
        rr::FragmentShader::~FragmentShader((FragmentShader *)local_480);
        rr::VertexShader::~VertexShader((VertexShader *)local_618);
      }
      lVar50 = lVar50 + 1;
      pDVar25 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar43 = lVar43 + 0x80;
    } while (lVar50 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar25) >> 7));
  }
  rr::Renderer::~Renderer((Renderer *)&local_1f8);
  if ((TextureFormat)local_3a8._M_dataplus._M_p != (TextureFormat)0x0) {
    operator_delete(local_3a8._M_dataplus._M_p,
                    local_3a8.field_2._M_allocated_capacity - (long)local_3a8._M_dataplus._M_p);
  }
  glu::ShaderProgram::~ShaderProgram(&local_158);
  iVar18 = (*local_5a8->_vptr_RenderContext[3])();
  lVar43 = CONCAT44(extraout_var_01,iVar18);
  (**(code **)(lVar43 + 0x78))(0x8d40,local_1a0.m_object);
  if (0 < (int)((ulong)((long)local_180.m_objects.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_180.m_objects.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    lVar50 = 0;
    do {
      pTVar14 = local_1b8.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar18 = local_1b8.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar50].m_size.m_data[0];
      iVar40 = local_1b8.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar50].m_size.m_data[1];
      local_3b0 = local_1b8.
                  super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar50].m_format;
      TVar20 = tcu::getTextureChannelClass(local_3b0.type);
      local_378._0_4_ = RGBA;
      local_378._4_4_ = UNORM_INT8;
      if (TVar20 < TEXTURECHANNELCLASS_LAST) {
        local_378 = *(undefined1 (*) [8])(&DAT_01ccb9a8 + (ulong)TVar20 * 8);
      }
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&local_158,(TextureFormat *)local_378,iVar18,iVar40,1);
      iVar18 = (int)lVar50;
      (**(code **)(lVar43 + 0x1218))(iVar18 + 0x8ce0);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_378,(TextureLevel *)&local_158);
      glu::readPixels(local_5a8,0,0,(PixelBufferAccess *)local_378);
      dVar19 = (**(code **)(lVar43 + 0x800))();
      glu::checkError(dVar19,"Reading pixels from renderbuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                      ,0x234);
      TVar20 = tcu::getTextureChannelClass(local_3b0.type);
      pTVar52 = pTVar14 + lVar50;
      if (TVar20 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
        std::ostream::operator<<((ConstPixelBufferAccess *)local_378,iVar18);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
        std::ios_base::~ios_base(local_308);
        pTVar24 = (TextureFormat *)
                  std::__cxx11::string::replace((ulong)local_598,0,(char *)0x0,0x1a57144);
        local_648._0_8_ = &local_638;
        TVar47 = (TextureFormat)(pTVar24 + 2);
        if (*pTVar24 == TVar47) {
          local_638 = *(key_type **)TVar47;
          aStack_630._M_allocated_capacity = (size_type)pTVar24[3];
        }
        else {
          local_638 = *(key_type **)TVar47;
          local_648._0_8_ = *pTVar24;
        }
        local_648._8_8_ = pTVar24[1];
        *pTVar24 = TVar47;
        pTVar24[1].order = R;
        pTVar24[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar24[2].order = R;
        if (local_598 != (undefined1  [8])local_588) {
          operator_delete((void *)local_598,local_588._0_8_ + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
        std::ostream::operator<<((ConstPixelBufferAccess *)local_378,iVar18);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
        std::ios_base::~ios_base(local_308);
        plVar26 = (long *)std::__cxx11::string::replace((ulong)local_598,0,(char *)0x0,0x1ccc358);
        local_5d8._0_8_ = &local_5c8;
        paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar26 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar26 == paVar29) {
          local_5c8 = (undefined1 *)paVar29->_M_allocated_capacity;
          aStack_5c0._M_allocated_capacity = plVar26[3];
        }
        else {
          local_5c8 = (undefined1 *)paVar29->_M_allocated_capacity;
          local_5d8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar26;
        }
        local_5d8._8_8_ = plVar26[1];
        *plVar26 = (long)paVar29;
        plVar26[1] = 0;
        *(undefined1 *)(plVar26 + 2) = 0;
        if (local_598 != (undefined1  [8])local_588) {
          operator_delete((void *)local_598,local_588._0_8_ + 1);
        }
        local_188 = (TextureFormat)
                    local_158.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        tcu::getTextureFormatBitDepth((tcu *)&local_4a8,&local_3b0);
        tcu::getTextureFormatBitDepth((tcu *)&local_1e8,&local_188);
        imageSetDesc = local_5d8._0_8_;
        uVar45 = local_648._0_8_;
        lVar51 = 0;
        do {
          *(undefined4 *)((long)&local_3a8._M_dataplus._M_p + lVar51 * 4) = 0x40400000;
          lVar51 = lVar51 + 1;
        } while (lVar51 != 4);
        lVar51 = 0;
        do {
          *(undefined8 *)(local_480 + lVar51 * 8) = 1;
          lVar51 = lVar51 + 1;
        } while (lVar51 != 4);
        local_78[0] = PRIMITIVETYPE_TRIANGLES;
        local_78[1] = PRIMITIVETYPE_TRIANGLES;
        local_78[2] = PRIMITIVETYPE_TRIANGLES;
        local_78[3] = PRIMITIVETYPE_TRIANGLES;
        lVar51 = 0;
        do {
          PVar4 = *(PrimitiveType *)((long)&local_4a8._M_dataplus._M_p + lVar51 * 4);
          PVar39 = (&local_1e8.m_primitiveType)[lVar51];
          if ((int)PVar4 < (int)(&local_1e8.m_primitiveType)[lVar51]) {
            PVar39 = PVar4;
          }
          local_78[lVar51] = PVar39;
          lVar51 = lVar51 + 1;
        } while (lVar51 != 4);
        local_6a8 = (undefined1  [8])0x0;
        aStack_6a0.m_align = 0;
        local_6b8 = (undefined1  [8])0x0;
        aStack_6b0.m_align = 0;
        lVar51 = 0;
        do {
          *(long *)(local_6b8 + lVar51 * 8) = (long)(int)local_78[lVar51];
          lVar51 = lVar51 + 1;
        } while (lVar51 != 4);
        local_588._0_8_ = 0;
        local_588._8_8_ = 0;
        local_598._0_4_ = R;
        local_598._4_4_ = SNORM_INT8;
        TStack_590.order = R;
        TStack_590.type = SNORM_INT8;
        lVar51 = 0;
        do {
          *(long *)(local_598 + lVar51 * 8) =
               *(long *)(local_480 + lVar51 * 8) << (local_6b8[lVar51 * 8] & 0x3f);
          lVar51 = lVar51 + 1;
        } while (lVar51 != 4);
        lVar51 = 0;
        do {
          *(undefined8 *)(local_618 + lVar51 * 8) = 1;
          lVar51 = lVar51 + 1;
        } while (lVar51 != 4);
        local_368._0_4_ = 0;
        local_368._4_2_ = 0;
        local_368[6] = '\0';
        local_368[7] = '\0';
        local_368[8] = '\0';
        local_368._9_2_ = 0;
        local_368[0xb] = '\0';
        local_368._12_2_ = 0;
        local_368[0xe] = '\0';
        local_368[0xf] = '\0';
        local_378._0_4_ = R;
        local_378._4_4_ = SNORM_INT8;
        auStack_370._0_4_ = R;
        auStack_370._4_4_ = SNORM_INT8;
        lVar51 = 0;
        do {
          *(long *)(local_378 + lVar51 * 8) =
               *(long *)(local_598 + lVar51 * 8) - *(long *)(local_618 + lVar51 * 8);
          lVar51 = lVar51 + 1;
        } while (lVar51 != 4);
        local_1f8 = 0;
        uStack_1f0 = 0;
        lVar51 = 0;
        do {
          *(float *)((long)&local_1f8 + lVar51 * 4) = (float)*(ulong *)(local_378 + lVar51 * 8);
          lVar51 = lVar51 + 1;
        } while (lVar51 != 4);
        local_88.m_data[0] = 0.0;
        local_88.m_data[1] = 0.0;
        local_88.m_data[2] = 0.0;
        local_88.m_data[3] = 0.0;
        lVar51 = 0;
        do {
          local_88.m_data[lVar51] =
               *(float *)((long)&local_3a8._M_dataplus._M_p + lVar51 * 4) /
               *(float *)((long)&local_1f8 + lVar51 * 4);
          lVar51 = lVar51 + 1;
        } while (lVar51 != 4);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_378,pTVar52);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_598,(TextureLevel *)&local_158);
        bVar16 = tcu::floatThresholdCompare
                           (log,(char *)uVar45,(char *)imageSetDesc,
                            (ConstPixelBufferAccess *)local_378,(ConstPixelBufferAccess *)local_598,
                            &local_88,COMPARE_LOG_RESULT);
        if (!bVar16) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_378,iVar18);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
          std::ios_base::~ios_base(local_308);
          pTVar24 = (TextureFormat *)
                    std::__cxx11::string::replace((ulong)local_6b8,0,(char *)0x0,0x1ccc36e);
          local_480 = (undefined1  [8])&local_470;
          TVar47 = (TextureFormat)(pTVar24 + 2);
          if (*pTVar24 == TVar47) {
            local_470._M_allocated_capacity = *(undefined8 *)TVar47;
            local_470._8_8_ = pTVar24[3];
          }
          else {
            local_470._M_allocated_capacity = *(undefined8 *)TVar47;
            local_480 = (undefined1  [8])*pTVar24;
          }
          local_478 = pTVar24[1];
          *pTVar24 = TVar47;
          pTVar24[1].order = R;
          pTVar24[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar24[2].order = R;
          pTVar24 = (TextureFormat *)std::__cxx11::string::append(local_480);
          local_598 = (undefined1  [8])local_588;
          TVar47 = (TextureFormat)(pTVar24 + 2);
          if (*pTVar24 == TVar47) {
            local_588._0_8_ = *(undefined8 *)TVar47;
            local_588._8_8_ = pTVar24[3];
          }
          else {
            local_588._0_8_ = *(undefined8 *)TVar47;
            local_598 = (undefined1  [8])*pTVar24;
          }
          TStack_590 = pTVar24[1];
          *pTVar24 = TVar47;
          pTVar24[1].order = R;
          pTVar24[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar24[2].order = R;
          tcu::ResultCollector::fail(local_380,(string *)local_598);
          if (local_598 != (undefined1  [8])local_588) {
            operator_delete((void *)local_598,local_588._0_8_ + 1);
          }
          if (local_480 != (undefined1  [8])&local_470) {
            operator_delete((void *)local_480,(ulong)(local_470._M_allocated_capacity + 1));
          }
          if (local_6b8 != (undefined1  [8])(local_6b8 + 0x10)) {
            operator_delete((void *)local_6b8,(ulong)((long)local_6a8 + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&local_5c8) {
          operator_delete((void *)local_5d8._0_8_,(ulong)((long)local_5c8 + 1));
        }
        uVar45 = local_638;
        TVar47 = (TextureFormat)local_648._0_8_;
        if ((key_type **)local_648._0_8_ != &local_638) goto LAB_01698cab;
      }
      else {
        if (TVar20 - TEXTURECHANNELCLASS_SIGNED_INTEGER < 2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_378,iVar18);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
          std::ios_base::~ios_base(local_308);
          pTVar24 = (TextureFormat *)
                    std::__cxx11::string::replace((ulong)local_598,0,(char *)0x0,0x1a57144);
          local_480 = (undefined1  [8])&local_470;
          TVar47 = (TextureFormat)(pTVar24 + 2);
          if (*pTVar24 == TVar47) {
            local_470._M_allocated_capacity = *(undefined8 *)TVar47;
            local_470._8_8_ = pTVar24[3];
          }
          else {
            local_470._M_allocated_capacity = *(undefined8 *)TVar47;
            local_480 = (undefined1  [8])*pTVar24;
          }
          local_478 = pTVar24[1];
          *pTVar24 = TVar47;
          pTVar24[1].order = R;
          pTVar24[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar24[2].order = R;
          if (local_598 != (undefined1  [8])local_588) {
            operator_delete((void *)local_598,local_588._0_8_ + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_378,iVar18);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
          std::ios_base::~ios_base(local_308);
          puVar34 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_598,0,(char *)0x0,0x1ccc358);
          local_6b8 = (undefined1  [8])(local_6b8 + 0x10);
          pcVar44 = (char *)(puVar34 + 2);
          if ((char *)*puVar34 == pcVar44) {
            local_6a8 = *(undefined1 (*) [8])pcVar44;
            aStack_6a0.m_align = puVar34[3];
          }
          else {
            local_6a8 = *(undefined1 (*) [8])pcVar44;
            local_6b8 = (undefined1  [8])*puVar34;
          }
          aStack_6b0 = *(anon_union_8_2_d0736028_for_Maybe<bool>_2 *)(puVar34 + 1);
          *puVar34 = pcVar44;
          puVar34[1] = 0;
          *(undefined1 *)(puVar34 + 2) = 0;
          if (local_598 != (undefined1  [8])local_588) {
            operator_delete((void *)local_598,local_588._0_8_ + 1);
          }
          auVar13 = local_480;
          auVar11 = local_6b8;
          local_5d8._0_8_ = &DAT_100000001;
          local_5d8._8_8_ = &DAT_100000001;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_378,pTVar52);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_598,(TextureLevel *)&local_158);
          bVar16 = tcu::intThresholdCompare
                             (log,(char *)auVar13,(char *)auVar11,
                              (ConstPixelBufferAccess *)local_378,
                              (ConstPixelBufferAccess *)local_598,(UVec4 *)local_5d8,
                              COMPARE_LOG_RESULT);
          if (!bVar16) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
            std::ostream::operator<<((ConstPixelBufferAccess *)local_378,iVar18);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
            std::ios_base::~ios_base(local_308);
            plVar26 = (long *)std::__cxx11::string::replace
                                        ((ulong)local_648,0,(char *)0x0,0x1ccc36e);
            local_618._0_8_ = &local_608;
            paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar26 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar26 == paVar29) {
              local_608._M_allocated_capacity = paVar29->_M_allocated_capacity;
              local_608._8_8_ = plVar26[3];
            }
            else {
              local_608._M_allocated_capacity = paVar29->_M_allocated_capacity;
              local_618._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar26;
            }
            unique0x00012000 = (pointer)plVar26[1];
            *plVar26 = (long)paVar29;
            plVar26[1] = 0;
            *(undefined1 *)(plVar26 + 2) = 0;
            pTVar24 = (TextureFormat *)std::__cxx11::string::append(local_618);
            local_598 = (undefined1  [8])local_588;
            TVar47 = (TextureFormat)(pTVar24 + 2);
            if (*pTVar24 == TVar47) {
              local_588._0_8_ = *(undefined8 *)TVar47;
              local_588._8_8_ = pTVar24[3];
            }
            else {
              local_588._0_8_ = *(undefined8 *)TVar47;
              local_598 = (undefined1  [8])*pTVar24;
            }
            TStack_590 = pTVar24[1];
            *pTVar24 = TVar47;
            pTVar24[1].order = R;
            pTVar24[1].type = SNORM_INT8;
            *(undefined1 *)&pTVar24[2].order = R;
            tcu::ResultCollector::fail(local_380,(string *)local_598);
LAB_01698c03:
            if (local_598 != (undefined1  [8])local_588) {
              operator_delete((void *)local_598,local_588._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_618._0_8_ != &local_608) {
              operator_delete((void *)local_618._0_8_,local_608._M_allocated_capacity + 1);
            }
            if ((key_type **)local_648._0_8_ != &local_638) {
              operator_delete((void *)local_648._0_8_,
                              (ulong)((long)&(((PixelBufferAccess *)&local_638->_M_dataplus)->
                                             super_ConstPixelBufferAccess).m_format.order + 1));
            }
          }
        }
        else {
          if (TVar20 != TEXTURECHANNELCLASS_FLOATING_POINT) goto LAB_01698cb3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_378,iVar18);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
          std::ios_base::~ios_base(local_308);
          pTVar24 = (TextureFormat *)
                    std::__cxx11::string::replace((ulong)local_598,0,(char *)0x0,0x1a57144);
          local_480 = (undefined1  [8])&local_470;
          TVar47 = (TextureFormat)(pTVar24 + 2);
          if (*pTVar24 == TVar47) {
            local_470._M_allocated_capacity = *(undefined8 *)TVar47;
            local_470._8_8_ = pTVar24[3];
          }
          else {
            local_470._M_allocated_capacity = *(undefined8 *)TVar47;
            local_480 = (undefined1  [8])*pTVar24;
          }
          local_478 = pTVar24[1];
          *pTVar24 = TVar47;
          pTVar24[1].order = R;
          pTVar24[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar24[2].order = R;
          if (local_598 != (undefined1  [8])local_588) {
            operator_delete((void *)local_598,local_588._0_8_ + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_378,iVar18);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
          std::ios_base::~ios_base(local_308);
          puVar34 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_598,0,(char *)0x0,0x1ccc358);
          local_6b8 = (undefined1  [8])(local_6b8 + 0x10);
          pcVar44 = (char *)(puVar34 + 2);
          if ((char *)*puVar34 == pcVar44) {
            local_6a8 = *(undefined1 (*) [8])pcVar44;
            aStack_6a0.m_align = puVar34[3];
          }
          else {
            local_6a8 = *(undefined1 (*) [8])pcVar44;
            local_6b8 = (undefined1  [8])*puVar34;
          }
          aStack_6b0 = *(anon_union_8_2_d0736028_for_Maybe<bool>_2 *)(puVar34 + 1);
          *puVar34 = pcVar44;
          puVar34[1] = 0;
          *(undefined1 *)(puVar34 + 2) = 0;
          if (local_598 != (undefined1  [8])local_588) {
            operator_delete((void *)local_598,local_588._0_8_ + 1);
          }
          local_3a8._M_dataplus._M_p =
               (pointer)local_158.m_shaders[0].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
          tcu::getTextureFormatMantissaBitDepth((tcu *)local_378,&local_3b0);
          tcu::getTextureFormatMantissaBitDepth((tcu *)local_598,(TextureFormat *)&local_3a8);
          auVar13 = local_480;
          auVar11 = local_6b8;
          local_618._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          stack0xfffffffffffff9f0 = (pointer)0x0;
          lVar51 = 0;
          do {
            if (*(int *)(local_378 + lVar51 * 4) <= *(int *)(local_598 + lVar51 * 4)) {
              *(int *)(local_618 + lVar51 * 4) =
                   *(int *)(local_598 + lVar51 * 4) - *(int *)(local_378 + lVar51 * 4);
            }
            lVar51 = lVar51 + 1;
          } while (lVar51 != 4);
          lVar51 = 0;
          do {
            *(undefined4 *)(local_648 + lVar51 * 4) = 4;
            lVar51 = lVar51 + 1;
          } while (lVar51 != 4);
          lVar51 = 0;
          do {
            *(undefined4 *)((long)&local_4a8._M_dataplus._M_p + lVar51 * 4) = 1;
            lVar51 = lVar51 + 1;
          } while (lVar51 != 4);
          local_5d8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_5d8._8_8_ = (undefined1 *)0x0;
          lVar51 = 0;
          do {
            *(int *)(local_5d8 + lVar51 * 4) =
                 *(int *)((long)&local_4a8._M_dataplus._M_p + lVar51 * 4) <<
                 (local_618[lVar51 * 4] & 0x1f);
            lVar51 = lVar51 + 1;
          } while (lVar51 != 4);
          local_1e8._0_8_ = 0;
          local_1e8.m_numElements = 0;
          lVar51 = 0;
          do {
            (&local_1e8.m_primitiveType)[lVar51] =
                 *(int *)(local_5d8 + lVar51 * 4) * *(int *)(local_648 + lVar51 * 4);
            lVar51 = lVar51 + 1;
          } while (lVar51 != 4);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_378,pTVar52);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_598,(TextureLevel *)&local_158);
          bVar16 = tcu::floatUlpThresholdCompare
                             (log,(char *)auVar13,(char *)auVar11,
                              (ConstPixelBufferAccess *)local_378,
                              (ConstPixelBufferAccess *)local_598,(UVec4 *)&local_1e8,
                              COMPARE_LOG_RESULT);
          if (!bVar16) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
            std::ostream::operator<<((ConstPixelBufferAccess *)local_378,iVar18);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
            std::ios_base::~ios_base(local_308);
            puVar34 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,0x1ccc36e);
            local_618._0_8_ = &local_608;
            paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar34 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar34 == paVar29) {
              local_608._M_allocated_capacity = paVar29->_M_allocated_capacity;
              local_608._8_8_ = puVar34[3];
            }
            else {
              local_608._M_allocated_capacity = paVar29->_M_allocated_capacity;
              local_618._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar34;
            }
            unique0x00012000 = (pointer)puVar34[1];
            *puVar34 = paVar29;
            puVar34[1] = 0;
            *(undefined1 *)(puVar34 + 2) = 0;
            pTVar24 = (TextureFormat *)std::__cxx11::string::append(local_618);
            local_598 = (undefined1  [8])local_588;
            TVar47 = (TextureFormat)(pTVar24 + 2);
            if (*pTVar24 == TVar47) {
              local_588._0_8_ = *(undefined8 *)TVar47;
              local_588._8_8_ = pTVar24[3];
            }
            else {
              local_588._0_8_ = *(undefined8 *)TVar47;
              local_598 = (undefined1  [8])*pTVar24;
            }
            TStack_590 = pTVar24[1];
            *pTVar24 = TVar47;
            pTVar24[1].order = R;
            pTVar24[1].type = SNORM_INT8;
            *(undefined1 *)&pTVar24[2].order = R;
            tcu::ResultCollector::fail(local_380,(string *)local_598);
            goto LAB_01698c03;
          }
        }
        if (local_6b8 != (undefined1  [8])(local_6b8 + 0x10)) {
          operator_delete((void *)local_6b8,(ulong)((long)local_6a8 + 1));
        }
        uVar45 = local_470._M_allocated_capacity;
        TVar47 = (TextureFormat)local_480;
        if (local_480 != (undefined1  [8])&local_470) {
LAB_01698cab:
          operator_delete((void *)TVar47,
                          (ulong)((long)&(((PixelBufferAccess *)&((key_type *)uVar45)->_M_dataplus)
                                         ->super_ConstPixelBufferAccess).m_format.order + 1));
        }
      }
LAB_01698cb3:
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&local_158);
      lVar50 = lVar50 + 1;
    } while (lVar50 < (int)((ulong)((long)local_180.m_objects.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_180.m_objects.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  (**(code **)(lVar43 + 0x78))(0x8d40,0);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector(&local_1b8);
  glu::ObjectWrapper::~ObjectWrapper(&local_1a0);
  glu::ObjectVector::~ObjectVector(&local_180);
  return;
}

Assistant:

void runTest (TestLog&						log,
			  tcu::ResultCollector&			results,
			  glu::RenderContext&			renderContext,

			  const BlendState&				preCommonBlendState,
			  const BlendState&				postCommonBlendState,
			  const vector<DrawBufferInfo>&	drawBuffers)
{
	const glw::Functions&	gl					= renderContext.getFunctions();
	glu::RenderbufferVector	renderbuffers		(gl, drawBuffers.size());
	glu::Framebuffer		framebuffer			(gl);
	vector<TextureLevel>	refRenderbuffers	(drawBuffers.size());

	logTestCaseInfo(log, preCommonBlendState, postCommonBlendState, drawBuffers);

	genRenderbuffers(gl, drawBuffers, framebuffer, renderbuffers, refRenderbuffers);

	renderQuad(log, renderContext, preCommonBlendState, postCommonBlendState, drawBuffers, framebuffer, refRenderbuffers);

	verifyRenderbuffers(log, results, renderContext, renderbuffers, framebuffer, refRenderbuffers);
}